

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

bool __thiscall cmMakefile::ReadDependentFile(cmMakefile *this,char *filename,bool noPolicyScope)

{
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  cmListFile listFile;
  IncludeScope incScope;
  string filenametoread;
  cmParseFileScope pfs;
  cmListFile local_98;
  IncludeScope local_78;
  string local_68;
  cmParseFileScope local_48;
  
  std::__cxx11::string::string((string *)&local_48,"CMAKE_PARENT_LIST_FILE",(allocator *)&local_98);
  std::__cxx11::string::string((string *)&local_68,"CMAKE_CURRENT_LIST_FILE",(allocator *)&local_78)
  ;
  pcVar3 = GetDefinition(this,&local_68);
  AddDefinition(this,(string *)&local_48,pcVar3);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string((string *)&local_48,filename,(allocator *)&local_98);
  pcVar3 = GetCurrentSourceDirectory(this);
  cmsys::SystemTools::CollapseFullPath(&local_68,(string *)&local_48,pcVar3);
  std::__cxx11::string::~string((string *)&local_48);
  IncludeScope::IncludeScope(&local_78,this,&local_68,noPolicyScope);
  local_98.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmParseFileScope::cmParseFileScope(&local_48,this);
  bVar1 = cmListFile::ParseFile(&local_98,local_68._M_dataplus._M_p,false,this);
  cmParseFileScope::~cmParseFileScope(&local_48);
  if (bVar1) {
    ReadListFile(this,&local_98,&local_68);
    bVar2 = cmSystemTools::GetFatalErrorOccured();
    if (bVar2) {
      local_78.ReportError = false;
    }
  }
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::~vector(&local_98.Functions)
  ;
  IncludeScope::~IncludeScope(&local_78);
  std::__cxx11::string::~string((string *)&local_68);
  return bVar1;
}

Assistant:

bool cmMakefile::ReadDependentFile(const char* filename, bool noPolicyScope)
{
  this->AddDefinition("CMAKE_PARENT_LIST_FILE",
                      this->GetDefinition("CMAKE_CURRENT_LIST_FILE"));
  std::string filenametoread =
    cmSystemTools::CollapseFullPath(filename,
                                    this->GetCurrentSourceDirectory());

  IncludeScope incScope(this, filenametoread, noPolicyScope);

  cmListFile listFile;
  {
  cmParseFileScope pfs(this);
  if (!listFile.ParseFile(filenametoread.c_str(), false, this))
    {
    return false;
    }
  }

  this->ReadListFile(listFile, filenametoread);
  if(cmSystemTools::GetFatalErrorOccured())
    {
    incScope.Quiet();
    }
  return true;
}